

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSources::ProcessRTCPSenderInfo
          (RTPSources *this,uint32_t ssrc,RTPNTPTime *ntptime,uint32_t rtptime,uint32_t packetcount,
          uint32_t octetcount,RTPTime *receivetime,RTPAddress *senderaddress)

{
  bool local_41;
  int status;
  bool created;
  RTPInternalSourceData *srcdat;
  uint32_t local_30;
  uint32_t octetcount_local;
  uint32_t packetcount_local;
  uint32_t rtptime_local;
  RTPNTPTime *ntptime_local;
  RTPSources *pRStack_18;
  uint32_t ssrc_local;
  RTPSources *this_local;
  
  srcdat._4_4_ = octetcount;
  local_30 = packetcount;
  octetcount_local = rtptime;
  _packetcount_local = ntptime;
  ntptime_local._4_4_ = ssrc;
  pRStack_18 = this;
  this_local._4_4_ =
       GetRTCPSourceData(this,ssrc,senderaddress,(RTPInternalSourceData **)&status,&local_41);
  if (-1 < this_local._4_4_) {
    if (_status == (RTPInternalSourceData *)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      RTPInternalSourceData::ProcessSenderInfo
                (_status,_packetcount_local,octetcount_local,local_30,srcdat._4_4_,receivetime);
      if ((local_41 & 1U) != 0) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,_status);
      }
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xb])(this,_status);
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPSources::ProcessRTCPSenderInfo(uint32_t ssrc,const RTPNTPTime &ntptime,uint32_t rtptime,
                          uint32_t packetcount,uint32_t octetcount,const RTPTime &receivetime,
			  const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created;
	int status;
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;
	
	srcdat->ProcessSenderInfo(ntptime,rtptime,packetcount,octetcount,receivetime);
	
	// Call the callback
	if (created)
		OnNewSource(srcdat);

	OnRTCPSenderReport(srcdat);

	return 0;
}